

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_freeallobjects(lua_State *L)

{
  global_State *g_00;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  g_00->gcstp = '\x04';
  luaC_changemode(L,0);
  separatetobefnz(g_00,1);
  if (g_00->finobj != (GCObject *)0x0) {
    __assert_fail("g->finobj == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x646,"void luaC_freeallobjects(lua_State *)");
  }
  callallpendingfinalizers(L);
  if (9 < (g_00->mainthread->tt & 0xf)) {
    __assert_fail("(((g->mainthread)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x648,"void luaC_freeallobjects(lua_State *)");
  }
  deletelist(L,g_00->allgc,(GCObject *)g_00->mainthread);
  if (g_00->finobj != (GCObject *)0x0) {
    __assert_fail("g->finobj == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x649,"void luaC_freeallobjects(lua_State *)");
  }
  deletelist(L,g_00->fixedgc,(GCObject *)0x0);
  if ((g_00->strt).nuse == 0) {
    return;
  }
  __assert_fail("g->strt.nuse == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x64b,"void luaC_freeallobjects(lua_State *)");
}

Assistant:

void luaC_freeallobjects (lua_State *L) {
  global_State *g = G(L);
  g->gcstp = GCSTPCLS;  /* no extra finalizers after here */
  luaC_changemode(L, KGC_INC);
  separatetobefnz(g, 1);  /* separate all objects with finalizers */
  lua_assert(g->finobj == NULL);
  callallpendingfinalizers(L);
  deletelist(L, g->allgc, obj2gco(g->mainthread));
  lua_assert(g->finobj == NULL);  /* no new finalizers */
  deletelist(L, g->fixedgc, NULL);  /* collect fixed objects */
  lua_assert(g->strt.nuse == 0);
}